

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

ConcatStringMulti *
Js::ConcatStringMulti::New
          (uint slotCount,JavascriptString *a1,JavascriptString *a2,ScriptContext *scriptContext)

{
  ScriptContext *a2_00;
  JavascriptString *a1_00;
  uint slotCount_00;
  Recycler *pRVar1;
  ConcatStringMulti *this;
  JavascriptLibrary *this_00;
  StaticType *stringTypeStatic;
  TrackAllocData local_50;
  ScriptContext *local_28;
  ScriptContext *scriptContext_local;
  JavascriptString *a2_local;
  JavascriptString *a1_local;
  uint slotCount_local;
  
  local_28 = scriptContext;
  scriptContext_local = (ScriptContext *)a2;
  a2_local = a1;
  a1_local._4_4_ = slotCount;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,(ulong)a1_local._4_4_ << 3,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
             ,0x213);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this = (ConcatStringMulti *)new<Memory::Recycler>(0x30,pRVar1,0x446fd0,0);
  slotCount_00 = a1_local._4_4_;
  a1_00 = a2_local;
  a2_00 = scriptContext_local;
  this_00 = ScriptContext::GetLibrary(local_28);
  stringTypeStatic = JavascriptLibrary::GetStringTypeStatic(this_00);
  ConcatStringMulti(this,slotCount_00,a1_00,(JavascriptString *)a2_00,stringTypeStatic);
  return this;
}

Assistant:

ConcatStringMulti*
    ConcatStringMulti::New(uint slotCount, JavascriptString * a1, JavascriptString * a2, ScriptContext * scriptContext)
    {
        return RecyclerNewPlus(scriptContext->GetRecycler(),
            sizeof(JavascriptString *) * slotCount, ConcatStringMulti, slotCount, a1, a2,
            scriptContext->GetLibrary()->GetStringTypeStatic());
    }